

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

void __thiscall
slang::TypedBumpAllocator<slang::ast::Scope::WildcardImportData>::~TypedBumpAllocator
          (TypedBumpAllocator<slang::ast::Scope::WildcardImportData> *this)

{
  WildcardImportData *in_RDI;
  WildcardImportData *cur;
  Segment *seg;
  Segment *local_18;
  Segment *local_10;
  
  for (local_10 = (Segment *)
                  (in_RDI->wildcardImports).
                  super__Vector_base<const_slang::ast::WildcardImportSymbol_*,_std::allocator<const_slang::ast::WildcardImportSymbol_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; local_10 != (Segment *)0x0;
      local_10 = local_10->prev) {
    for (local_18 = local_10 + 1; local_18 != (Segment *)local_10->current; local_18 = local_18 + 5)
    {
      ast::Scope::WildcardImportData::~WildcardImportData(in_RDI);
    }
  }
  BumpAllocator::~BumpAllocator((BumpAllocator *)in_RDI);
  return;
}

Assistant:

~TypedBumpAllocator() {
        Segment* seg = head;
        while (seg) {
            for (T* cur = (T*)(seg + 1); cur != (T*)seg->current; cur++)
                cur->~T();
            seg = seg->prev;
        }
    }